

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O0

void getPointsBoudingBox(GLfloat (*points) [2],GLsizei n_points,GLfloat (*bounds) [2])

{
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  int local_44;
  double dStack_40;
  GLsizei i;
  double y_max;
  double y_min;
  double x_max;
  double x_min;
  GLfloat (*bounds_local) [2];
  GLsizei n_points_local;
  GLfloat (*points_local) [2];
  
  if (n_points != 0) {
    y_min = (double)(*points)[0];
    dStack_40 = (double)(*points)[1];
    y_max = dStack_40;
    x_max = y_min;
    for (local_44 = 1; local_44 < n_points; local_44 = local_44 + 1) {
      if (x_max <= (double)points[local_44][0]) {
        local_50 = x_max;
      }
      else {
        local_50 = (double)points[local_44][0];
      }
      x_max = local_50;
      if ((double)points[local_44][0] <= y_min) {
        local_58 = y_min;
      }
      else {
        local_58 = (double)points[local_44][0];
      }
      y_min = local_58;
      if (y_max <= (double)points[local_44][1]) {
        local_60 = y_max;
      }
      else {
        local_60 = (double)points[local_44][1];
      }
      y_max = local_60;
      if ((double)points[local_44][1] <= dStack_40) {
        local_68 = dStack_40;
      }
      else {
        local_68 = (double)points[local_44][1];
      }
      dStack_40 = local_68;
    }
    (*bounds)[0] = (float)x_max;
    (*bounds)[1] = (float)y_max;
    bounds[1][0] = (float)y_min;
    bounds[1][1] = (float)dStack_40;
  }
  return;
}

Assistant:

void getPointsBoudingBox(GLfloat points[][2], GLsizei n_points, GLfloat bounds[][2]) {
	if (n_points == 0) return;

	double x_min, x_max, y_min, y_max;
	x_min = x_max = points[0][0];
	y_min = y_max = points[0][1];

	for (GLsizei i = 1; i < n_points; i++) {
		x_min = MIN(points[i][0], x_min);
		x_max = MAX(points[i][0], x_max);
		y_min = MIN(points[i][1], y_min);
		y_max = MAX(points[i][1], y_max);
	}

	bounds[0][0] = x_min;
	bounds[0][1] = y_min;
	bounds[1][0] = x_max;
	bounds[1][1] = y_max;
}